

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iend,
                  U32 mls,U32 extDict)

{
  ulong *ip_00;
  BYTE *pBVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  uint *puVar12;
  char cVar13;
  long lVar14;
  ulong *puVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  BYTE *pBVar22;
  bool bVar23;
  U32 dummy32;
  BYTE *pInLoopLimit;
  uint *local_e8;
  uint *local_d0;
  uint local_b4;
  BYTE *local_b0;
  U32 *local_a8;
  BYTE *local_a0;
  ulong *local_98;
  ulong local_90;
  BYTE *local_88;
  ulong local_80;
  ulong *local_78;
  ulong *local_70;
  ulong *local_68;
  BYTE *local_60;
  BYTE *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  cVar13 = (char)cParams->hashLog;
  switch(mls) {
  case 5:
    lVar14 = -0x30e4432345000000;
    break;
  case 6:
    lVar14 = -0x30e4432340650000;
    break;
  case 7:
    lVar14 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar14 = -0x30e44323485a9b9d;
    break;
  default:
    uVar10 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar13 & 0x1fU));
    goto LAB_0017d847;
  }
  uVar10 = (ulong)(lVar14 * *(long *)ip) >> (-cVar13 & 0x3fU);
LAB_0017d847:
  local_a8 = ms->chainTable;
  uVar17 = ~(-1 << ((char)cParams->chainLog - 1U & 0x1f));
  uVar20 = ms->hashTable[uVar10];
  pBVar4 = (ms->window).base;
  pBVar5 = (ms->window).dictBase;
  local_48 = (ulong)(ms->window).dictLimit;
  uVar16 = (int)ip - (int)pBVar4;
  local_80 = (ulong)uVar16;
  uVar19 = uVar16 - uVar17;
  if (uVar16 < uVar17) {
    uVar19 = 0;
  }
  uVar8 = (ulong)((uVar16 & uVar17) * 2);
  uVar2 = (ms->window).lowLimit;
  uVar3 = cParams->searchLog;
  ms->hashTable[uVar10] = uVar16;
  local_d0 = local_a8 + uVar8;
  iVar18 = uVar16 + 9;
  if (uVar2 < uVar20) {
    local_58 = pBVar5 + local_48;
    local_60 = pBVar4 + local_48;
    local_e8 = local_a8 + uVar8 + 1;
    uVar16 = ~(-1 << ((byte)uVar3 & 0x1f));
    local_68 = (ulong *)(iend + -7);
    local_70 = (ulong *)(iend + -3);
    local_78 = (ulong *)(iend + -1);
    local_b0 = pBVar4 + 8;
    local_88 = ip + 8;
    local_38 = 8;
    local_40 = 0;
    local_90 = 0;
    local_a0 = ip;
    local_98 = (ulong *)iend;
LAB_0017d954:
    uVar10 = local_48;
    uVar21 = (ulong)uVar20;
    uVar8 = local_90;
    if (local_40 < local_90) {
      uVar8 = local_40;
    }
    uVar9 = uVar8 + uVar21;
    ip_00 = (ulong *)(local_a0 + uVar8);
    if ((extDict == 0) || (local_48 <= uVar9)) {
      puVar15 = (ulong *)(pBVar4 + uVar21 + uVar8);
      puVar11 = ip_00;
      if (ip_00 < local_68) {
        if (*puVar15 == *ip_00) {
          lVar14 = 0;
          do {
            puVar11 = (ulong *)(local_88 + lVar14 + uVar8);
            if (local_68 <= puVar11) {
              puVar15 = (ulong *)(local_b0 + uVar9 + lVar14);
              goto LAB_0017da67;
            }
            lVar6 = lVar14 + uVar9;
            lVar14 = lVar14 + 8;
          } while (*(ulong *)(local_b0 + lVar6) == *puVar11);
          uVar9 = *puVar11 ^ *(ulong *)(local_b0 + lVar6);
          uVar10 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar10 = (uVar10 >> 3 & 0x1fffffff) + lVar14;
        }
        else {
          uVar9 = *ip_00 ^ *puVar15;
          uVar10 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar10 = uVar10 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_0017da67:
        if ((puVar11 < local_70) && ((int)*puVar15 == (int)*puVar11)) {
          puVar11 = (ulong *)((long)puVar11 + 4);
          puVar15 = (ulong *)((long)puVar15 + 4);
        }
        if ((puVar11 < local_78) && ((short)*puVar15 == (short)*puVar11)) {
          puVar11 = (ulong *)((long)puVar11 + 2);
          puVar15 = (ulong *)((long)puVar15 + 2);
        }
        if (puVar11 < local_98) {
          puVar11 = (ulong *)((long)puVar11 + (ulong)((byte)*puVar15 == (byte)*puVar11));
        }
        uVar10 = (long)puVar11 - (long)ip_00;
      }
      uVar8 = uVar10 + uVar8;
      pBVar22 = pBVar4 + uVar21;
    }
    else {
      pBVar1 = pBVar5 + uVar21;
      local_50 = uVar21;
      sVar7 = ZSTD_count_2segments((BYTE *)ip_00,pBVar1 + uVar8,(BYTE *)local_98,local_58,local_60);
      uVar8 = sVar7 + uVar8;
      uVar20 = (uint)local_50;
      pBVar22 = pBVar4 + uVar21;
      if (uVar8 + uVar21 < uVar10) {
        pBVar22 = pBVar1;
      }
    }
    if ((local_38 < uVar8) && (local_38 = uVar8, iVar18 - uVar20 < uVar8)) {
      iVar18 = uVar20 + (int)uVar8;
    }
    if ((ulong *)(local_a0 + uVar8) == local_98) goto LAB_0017dbae;
    puVar12 = local_a8 + (uVar20 & uVar17) * 2;
    if (pBVar22[uVar8] < (byte)*(ulong *)(local_a0 + uVar8)) {
      *local_d0 = uVar20;
      if (uVar20 <= uVar19) {
        local_d0 = &local_b4;
LAB_0017dbae:
        *local_e8 = 0;
        *local_d0 = 0;
        if (0x180 < local_38) {
          uVar20 = (int)local_38 - 0x180;
          if (uVar20 < 0xc0) {
            return uVar20;
          }
          return 0xc0;
        }
        goto LAB_0017dbda;
      }
      puVar12 = puVar12 + 1;
      local_40 = uVar8;
      local_d0 = puVar12;
    }
    else {
      *local_e8 = uVar20;
      local_e8 = puVar12;
      local_90 = uVar8;
      if (uVar20 <= uVar19) {
        local_e8 = &local_b4;
        goto LAB_0017dbae;
      }
    }
    bVar23 = uVar16 == 0;
    uVar16 = uVar16 - 1;
    if ((bVar23) || (uVar20 = *puVar12, uVar20 <= uVar2)) goto LAB_0017dbae;
    goto LAB_0017d954;
  }
  local_d0[0] = 0;
  local_d0[1] = 0;
  local_80._0_4_ = uVar16;
LAB_0017dbda:
  return (iVar18 - (uint)local_80) - 8;
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, U32 const extDict)
{
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 current = (U32)(ip-base);
    const U32 btLow = btMask >= current ? 0 : current - btMask;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = current+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((current-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((current-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", current);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = current;   /* Update Hash Table */

    while (nbCompares-- && (matchIndex > windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if ((!extDict) || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if extDict is incorrectly set to 0 */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    if (bestLength > 384) return MIN(192, (U32)(bestLength - 384));   /* speed optimization */
    assert(matchEndIdx > current + 8);
    return matchEndIdx - (current + 8);
}